

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void us_internal_free_closed_sockets(us_loop_t *loop)

{
  long in_RDI;
  us_socket_t *next;
  us_socket_t *s;
  us_loop_t *loop_00;
  us_loop_t *p;
  
  if (*(long *)(in_RDI + 0x48) != 0) {
    p = *(us_loop_t **)(in_RDI + 0x48);
    while (p != (us_loop_t *)0x0) {
      loop_00 = (us_loop_t *)(p->data).iterator;
      us_poll_free((us_poll_t *)p,loop_00);
      p = loop_00;
    }
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  return;
}

Assistant:

void us_internal_free_closed_sockets(struct us_loop_t *loop) {
    /* Free all closed sockets (maybe it is better to reverse order?) */
    if (loop->data.closed_head) {
        for (struct us_socket_t *s = loop->data.closed_head; s; ) {
            struct us_socket_t *next = s->next;
            us_poll_free((struct us_poll_t *) s, loop);
            s = next;
        }
        loop->data.closed_head = 0;
    }
}